

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O2

void Abc_NtkConvertDcLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pAVar3;
  char *pcVar4;
  Abc_Obj_t *pNodeTo;
  int iVar5;
  uint uVar6;
  
  iVar5 = 0;
  do {
    if (pNtk->vBoxes->nSize <= iVar5) {
      return;
    }
    pAVar2 = Abc_NtkBox(pNtk,iVar5);
    if ((*(uint *)&pAVar2->field_0x14 & 0xf) == 8) {
      iVar1 = Abc_LatchIsInitDc(pAVar2);
      if (iVar1 != 0) {
        pAVar2 = Abc_NtkCreateNodeConst1(pNtk);
        pAVar2 = Abc_NtkAddLatch(pNtk,pAVar2,ABC_INIT_ZERO);
        uVar6 = 0;
        for (iVar5 = 0; iVar5 < pNtk->vBoxes->nSize; iVar5 = iVar5 + 1) {
          pLatch = Abc_NtkBox(pNtk,iVar5);
          if ((*(uint *)&pLatch->field_0x14 & 0xf) == 8) {
            iVar1 = Abc_LatchIsInitDc(pLatch);
            if (iVar1 != 0) {
              pLatch->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
              pAVar3 = Abc_NodeFindCoFanout
                                 ((Abc_Obj_t *)
                                  pLatch->pNtk->vObjs->pArray[*(pLatch->vFanouts).pArray]);
              if (pAVar3 != (Abc_Obj_t *)0x0) {
                Nm_ManDeleteIdName(pLatch->pNtk->pManName,
                                   *(int *)((long)pLatch->pNtk->vObjs->pArray
                                                  [*(pLatch->vFanouts).pArray] + 0x10));
                pAVar3 = (Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanouts).pArray];
                pcVar4 = Abc_ObjName(pLatch);
                Abc_ObjAssignName(pAVar3,pcVar4,"_lo");
              }
              pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
              pcVar4 = Abc_ObjName(pLatch);
              Abc_ObjAssignName(pAVar3,pcVar4,"_pi");
              pNodeTo = Abc_NtkCreateNode(pNtk);
              Abc_ObjTransferFanout
                        ((Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanouts).pArray],
                         pNodeTo);
              Abc_NtkNodeConvertToMux
                        (pNtk,pAVar2,
                         (Abc_Obj_t *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanouts).pArray],pAVar3
                         ,pNodeTo);
              uVar6 = uVar6 + 1;
            }
          }
        }
        printf("The number of converted latches with DC values = %d.\n",(ulong)uVar6);
        return;
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Abc_NtkConvertDcLatches( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pCtrl, * pLatch, * pMux, * pPi;
    Abc_InitType_t Init = ABC_INIT_ZERO;
    int i, fFound = 0, Counter;
    // check if there are latches with DC values
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        if ( Abc_LatchIsInitDc(pLatch) )
        {
            fFound = 1;
            break;
        }
    if ( !fFound )
        return;
    // add control latch
    pCtrl = Abc_NtkAddLatch( pNtk, Abc_NtkCreateNodeConst1(pNtk), Init );
    // add fanouts for each latch with DC values
    Counter = 0;
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( !Abc_LatchIsInitDc(pLatch) )
            continue;
        // change latch value
        pLatch->pData = (void *)Init;
        // if the latch output has the same name as a PO, rename it
        if ( Abc_NodeFindCoFanout( Abc_ObjFanout0(pLatch) ) )
        {
            Nm_ManDeleteIdName( pLatch->pNtk->pManName, Abc_ObjFanout0(pLatch)->Id );
            Abc_ObjAssignName( Abc_ObjFanout0(pLatch), Abc_ObjName(pLatch), "_lo" );
        }
        // create new PIs
        pPi = Abc_NtkCreatePi( pNtk );
        Abc_ObjAssignName( pPi, Abc_ObjName(pLatch), "_pi" );
        // create a new node and transfer fanout from latch output to the new node
        pMux = Abc_NtkCreateNode( pNtk );
        Abc_ObjTransferFanout( Abc_ObjFanout0(pLatch), pMux );
        // convert the node into a mux
        Abc_NtkNodeConvertToMux( pNtk, pCtrl, Abc_ObjFanout0(pLatch), pPi, pMux );
        Counter++;
    }
    printf( "The number of converted latches with DC values = %d.\n", Counter );
}